

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeDisplay.cpp
# Opt level: O3

void __thiscall
eglu::NativeDisplayFactory::NativeDisplayFactory
          (NativeDisplayFactory *this,string *name,string *description,Capability capabilities,
          EGLenum platformType,char *platformExtension)

{
  allocator<char> local_31;
  
  tcu::FactoryBase::FactoryBase(&this->super_FactoryBase,name,description);
  (this->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory =
       (_func_int **)&PTR__NativeDisplayFactory_021218a8;
  tcu::GenericFactoryRegistry::GenericFactoryRegistry(&(this->m_nativeWindowRegistry).m_registry);
  tcu::GenericFactoryRegistry::GenericFactoryRegistry(&(this->m_nativePixmapRegistry).m_registry);
  this->m_capabilities = capabilities;
  this->m_platformType = platformType;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_platformExtension,platformExtension,&local_31);
  return;
}

Assistant:

NativeDisplayFactory::NativeDisplayFactory (const std::string& name, const std::string& description, NativeDisplay::Capability capabilities, EGLenum platformType, const char* platformExtension)
	: FactoryBase			(name, description)
	, m_capabilities		(capabilities)
	, m_platformType		(platformType)
	, m_platformExtension	(platformExtension)
{
	DE_ASSERT(platformType != EGL_NONE && platformExtension);
	DE_ASSERT(capabilities & NativeDisplay::CAPABILITY_GET_DISPLAY_PLATFORM);
}